

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_flags_encoder.c
# Opt level: O2

lzma_ret lzma_filter_flags_encode(lzma_filter *filter,uint8_t *out,size_t *out_pos,size_t out_size)

{
  lzma_ret lVar1;
  ulong in_RAX;
  ulong uStack_28;
  uint32_t props_size;
  
  if (filter->id >> 0x3e == 0) {
    uStack_28 = in_RAX;
    lVar1 = lzma_vli_encode(filter->id,(size_t *)0x0,out,out_pos,out_size);
    if (lVar1 != LZMA_OK) {
      return lVar1;
    }
    lVar1 = lzma_properties_size(&props_size,filter);
    if (lVar1 != LZMA_OK) {
      return lVar1;
    }
    lVar1 = lzma_vli_encode(uStack_28 >> 0x20,(size_t *)0x0,out,out_pos,out_size);
    if (lVar1 != LZMA_OK) {
      return lVar1;
    }
    if ((ulong)props_size <= out_size - *out_pos) {
      lVar1 = lzma_properties_encode(filter,out + *out_pos);
      if (lVar1 != LZMA_OK) {
        return lVar1;
      }
      *out_pos = *out_pos + (ulong)props_size;
      return LZMA_OK;
    }
  }
  return LZMA_PROG_ERROR;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filter_flags_encode(const lzma_filter *filter,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	// Filter ID
	if (filter->id >= LZMA_FILTER_RESERVED_START)
		return LZMA_PROG_ERROR;

	return_if_error(lzma_vli_encode(filter->id, NULL,
			out, out_pos, out_size));

	// Size of Properties
	uint32_t props_size;
	return_if_error(lzma_properties_size(&props_size, filter));
	return_if_error(lzma_vli_encode(props_size, NULL,
			out, out_pos, out_size));

	// Filter Properties
	if (out_size - *out_pos < props_size)
		return LZMA_PROG_ERROR;

	return_if_error(lzma_properties_encode(filter, out + *out_pos));

	*out_pos += props_size;

	return LZMA_OK;
}